

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O0

void __thiscall
Assimp::ObjExporter::indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
          (indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare> *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *keys)

{
  float fVar1;
  iterator this_00;
  bool bVar2;
  size_type __new_size;
  pointer ppVar3;
  pointer ppVar4;
  reference pvVar5;
  _Self local_28;
  _Self local_20;
  iterator it;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *keys_local;
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare> *this_local;
  
  it._M_node = (_Base_ptr)keys;
  __new_size = std::
               map<aiVector3t<float>,_int,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
               ::size(&this->vecMap);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(keys,__new_size);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<aiVector3t<float>,_int,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
       ::begin(&this->vecMap);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<aiVector3t<float>,_int,_Assimp::ObjExporter::aiVectorCompare,_std::allocator<std::pair<const_aiVector3t<float>,_int>_>_>
         ::end(&this->vecMap);
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_aiVector3t<float>,_int>_>::operator->(&local_20)
    ;
    this_00 = it;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_aiVector3t<float>,_int>_>::operator->(&local_20)
    ;
    pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        this_00._M_node,(long)(ppVar4->second + -1));
    fVar1 = (ppVar3->first).y;
    pvVar5->x = (ppVar3->first).x;
    pvVar5->y = fVar1;
    pvVar5->z = (ppVar3->first).z;
    std::_Rb_tree_iterator<std::pair<const_aiVector3t<float>,_int>_>::operator++(&local_20);
  }
  return;
}

Assistant:

void getKeys( std::vector<T>& keys ) {
            keys.resize(vecMap.size());
            for(typename dataType::iterator it = vecMap.begin(); it != vecMap.end(); ++it){
                keys[it->second-1] = it->first;
            }
        }